

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx2::
     BVHNIntersectorKHybrid<8,_8,_16777232,_false,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::InstanceIntersectorKMB<8>_>,_false>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  anon_union_32_3_898e2e57_for_vboolf_impl<8>_1 *paVar1;
  undefined4 uVar2;
  ulong uVar3;
  anon_union_32_3_898e2e57_for_vboolf_impl<8>_1 aVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  Primitive *prim;
  AABBNodeMB4D *node1;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  anon_union_32_3_898e2e57_for_vboolf_impl<8>_1 *paVar18;
  ulong *puVar19;
  anon_union_32_3_898e2e57_for_vboolf_impl<8>_1 aVar20;
  undefined1 auVar21 [32];
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  anon_union_32_3_898e2e57_for_vboolf_impl<8>_1 aVar24;
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 in_ZMM2 [64];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  Precalculations pre;
  vbool<8> valid0;
  NodeRef stack_node [561];
  vfloat<8> stack_near [561];
  Precalculations local_59c1;
  RayK<8> *local_59c0;
  RayQueryContext *local_59b8;
  Primitive *local_59b0;
  long local_59a8;
  undefined1 local_59a0 [32];
  anon_union_32_3_898e2e57_for_vboolf_impl<8>_1 local_5980;
  undefined1 local_5960 [32];
  undefined1 local_5940 [32];
  undefined1 local_5920 [32];
  undefined1 local_5900 [32];
  undefined1 local_58e0 [32];
  float local_58c0;
  float fStack_58bc;
  float fStack_58b8;
  float fStack_58b4;
  float fStack_58b0;
  float fStack_58ac;
  float fStack_58a8;
  undefined4 uStack_58a4;
  float local_58a0;
  float fStack_589c;
  float fStack_5898;
  float fStack_5894;
  float fStack_5890;
  float fStack_588c;
  float fStack_5888;
  undefined4 uStack_5884;
  float local_5880;
  float fStack_587c;
  float fStack_5878;
  float fStack_5874;
  float fStack_5870;
  float fStack_586c;
  float fStack_5868;
  undefined4 uStack_5864;
  anon_union_32_3_898e2e57_for_vboolf_impl<8>_1 local_5860;
  anon_union_32_3_898e2e57_for_vboolf_impl<8>_1 local_5840;
  undefined8 local_5810;
  ulong local_5808 [561];
  undefined1 local_4680 [32];
  anon_union_32_3_898e2e57_for_vboolf_impl<8>_1 local_4660 [561];
  
  local_5808[0] = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_5808[0] != 8) {
    auVar26 = vpcmpeqd_avx2(in_ZMM2._0_32_,in_ZMM2._0_32_);
    auVar22 = ZEXT816(0) << 0x40;
    auVar23 = vpcmpeqd_avx2(auVar26,(undefined1  [32])valid_i->field_0);
    auVar26 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar22),5);
    auVar21 = auVar23 & auVar26;
    if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar21 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar21 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar21 >> 0x7f,0) != '\0') ||
          (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar21 >> 0xbf,0) != '\0') ||
        (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar21[0x1f] < '\0')
    {
      local_59c0 = ray + 0x100;
      auVar26 = vandps_avx(auVar26,auVar23);
      auVar5 = vpackssdw_avx(auVar26._0_16_,auVar26._16_16_);
      auVar35._8_4_ = 0x7fffffff;
      auVar35._0_8_ = 0x7fffffff7fffffff;
      auVar35._12_4_ = 0x7fffffff;
      auVar35._16_4_ = 0x7fffffff;
      auVar35._20_4_ = 0x7fffffff;
      auVar35._24_4_ = 0x7fffffff;
      auVar35._28_4_ = 0x7fffffff;
      auVar26 = vandps_avx(*(undefined1 (*) [32])(ray + 0x80),auVar35);
      auVar42._8_4_ = 0x219392ef;
      auVar42._0_8_ = 0x219392ef219392ef;
      auVar42._12_4_ = 0x219392ef;
      auVar42._16_4_ = 0x219392ef;
      auVar42._20_4_ = 0x219392ef;
      auVar42._24_4_ = 0x219392ef;
      auVar42._28_4_ = 0x219392ef;
      auVar26 = vcmpps_avx(auVar26,auVar42,1);
      auVar21 = vblendvps_avx(*(undefined1 (*) [32])(ray + 0x80),auVar42,auVar26);
      auVar26 = vandps_avx(*(undefined1 (*) [32])(ray + 0xa0),auVar35);
      auVar26 = vcmpps_avx(auVar26,auVar42,1);
      auVar23 = vblendvps_avx(*(undefined1 (*) [32])(ray + 0xa0),auVar42,auVar26);
      auVar26 = vandps_avx(*(undefined1 (*) [32])(ray + 0xc0),auVar35);
      auVar26 = vcmpps_avx(auVar26,auVar42,1);
      auVar7 = vrcpps_avx(auVar21);
      auVar26 = vblendvps_avx(*(undefined1 (*) [32])(ray + 0xc0),auVar42,auVar26);
      auVar29._8_4_ = 0x3f800000;
      auVar29._0_8_ = 0x3f8000003f800000;
      auVar29._12_4_ = 0x3f800000;
      auVar29._16_4_ = 0x3f800000;
      auVar29._20_4_ = 0x3f800000;
      auVar29._24_4_ = 0x3f800000;
      auVar29._28_4_ = 0x3f800000;
      auVar8 = vfnmadd213ps_fma(auVar21,auVar7,auVar29);
      auVar35 = vrcpps_avx(auVar23);
      auVar9 = vfnmadd213ps_fma(auVar23,auVar35,auVar29);
      auVar42 = vrcpps_avx(auVar26);
      auVar10 = vfnmadd213ps_fma(auVar26,auVar42,auVar29);
      auVar26 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x60),ZEXT1632(auVar22));
      local_4680._8_4_ = 0x7f800000;
      local_4680._0_8_ = 0x7f8000007f800000;
      local_4680._12_4_ = 0x7f800000;
      local_4680._16_4_ = 0x7f800000;
      local_4680._20_4_ = 0x7f800000;
      local_4680._24_4_ = 0x7f800000;
      local_4680._28_4_ = 0x7f800000;
      local_5960 = vpmovsxwd_avx2(auVar5);
      local_5860 = (anon_union_32_3_898e2e57_for_vboolf_impl<8>_1)
                   vblendvps_avx(local_4680,auVar26,local_5960);
      auVar6 = vpcmpeqd_avx(auVar26._0_16_,auVar26._0_16_);
      local_59a0 = vpmovsxwd_avx2(auVar5 ^ auVar6);
      auVar26 = *(undefined1 (*) [32])ray;
      auVar21 = *(undefined1 (*) [32])(ray + 0x20);
      auVar5 = vfmadd132ps_fma(ZEXT1632(auVar9),auVar35,auVar35);
      auVar47 = ZEXT1664(auVar5);
      auVar35 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar22));
      auVar23._8_4_ = 0xff800000;
      auVar23._0_8_ = 0xff800000ff800000;
      auVar23._12_4_ = 0xff800000;
      auVar23._16_4_ = 0xff800000;
      auVar23._20_4_ = 0xff800000;
      auVar23._24_4_ = 0xff800000;
      auVar23._28_4_ = 0xff800000;
      auVar23 = vblendvps_avx(auVar23,auVar35,local_5960);
      auVar45 = ZEXT3264(auVar23);
      auVar22 = vfmadd132ps_fma(ZEXT1632(auVar8),auVar7,auVar7);
      auVar46 = ZEXT1664(auVar22);
      auVar6 = vfmadd132ps_fma(ZEXT1632(auVar10),auVar42,auVar42);
      auVar48 = ZEXT1664(auVar6);
      puVar19 = local_5808 + 1;
      local_5810 = 0xfffffffffffffff8;
      paVar18 = local_4660 + 1;
      local_4660[0] = local_5860;
      local_5880 = auVar22._0_4_ * -auVar26._0_4_;
      fStack_587c = auVar22._4_4_ * -auVar26._4_4_;
      fStack_5878 = auVar22._8_4_ * -auVar26._8_4_;
      fStack_5874 = auVar22._12_4_ * -auVar26._12_4_;
      fStack_5870 = -auVar26._16_4_ * 0.0;
      fStack_586c = -auVar26._20_4_ * 0.0;
      uStack_58a4 = auVar35._28_4_;
      fStack_5868 = -auVar26._24_4_ * 0.0;
      local_58a0 = auVar5._0_4_ * -auVar21._0_4_;
      fStack_589c = auVar5._4_4_ * -auVar21._4_4_;
      fStack_5898 = auVar5._8_4_ * -auVar21._8_4_;
      fStack_5894 = auVar5._12_4_ * -auVar21._12_4_;
      fStack_5890 = -auVar21._16_4_ * 0.0;
      fStack_588c = -auVar21._20_4_ * 0.0;
      fStack_5888 = -auVar21._24_4_ * 0.0;
      local_58c0 = auVar6._0_4_ * -*(float *)(ray + 0x40);
      fStack_58bc = auVar6._4_4_ * -*(float *)(ray + 0x44);
      fStack_58b8 = auVar6._8_4_ * -*(float *)(ray + 0x48);
      fStack_58b4 = auVar6._12_4_ * -*(float *)(ray + 0x4c);
      fStack_58b0 = -*(float *)(ray + 0x50) * 0.0;
      fStack_58ac = -*(float *)(ray + 0x54) * 0.0;
      fStack_58a8 = -*(float *)(ray + 0x58) * 0.0;
      local_5900 = ZEXT1632(auVar22);
      local_5920 = ZEXT1632(auVar5);
      local_5940 = ZEXT1632(auVar6);
      local_59b8 = context;
      uStack_5884 = uStack_58a4;
      uStack_5864 = uStack_58a4;
LAB_016b3039:
      uVar17 = puVar19[-1];
      if (uVar17 != 0xfffffffffffffff8) {
        puVar19 = puVar19 + -1;
        paVar1 = paVar18 + -1;
        paVar18 = paVar18 + -1;
        local_58e0 = auVar45._0_32_;
        aVar24.v = (__m256)vcmpps_avx(*paVar1,local_58e0,1);
        aVar20 = *paVar1;
        if (((((((((undefined1  [32])aVar24 >> 0x1f & (undefined1  [32])0x1) !=
                  (undefined1  [32])0x0 ||
                 ((undefined1  [32])aVar24 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                 ) || ((undefined1  [32])aVar24 >> 0x5f & (undefined1  [32])0x1) !=
                      (undefined1  [32])0x0) || SUB321((undefined1  [32])aVar24 >> 0x7f,0) != '\0')
              || ((undefined1  [32])aVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
              ) || SUB321((undefined1  [32])aVar24 >> 0xbf,0) != '\0') ||
            ((undefined1  [32])aVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            aVar24.i[7]._3_1_ < '\0') {
          do {
            uVar16 = (uint)uVar17;
            if ((uVar17 & 8) != 0) {
              if (uVar17 == 0xfffffffffffffff8) goto LAB_016b3378;
              auVar26 = vcmpps_avx(local_58e0,(undefined1  [32])aVar20,6);
              if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar26 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar26 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar26 >> 0x7f,0) != '\0') ||
                    (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar26 >> 0xbf,0) != '\0') ||
                  (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar26[0x1f] < '\0') {
                local_59b0 = (Primitive *)(uVar17 & 0xfffffffffffffff0);
                aVar20._0_8_ = local_59a0._0_8_ ^ 0xffffffffffffffff;
                aVar20._8_4_ = local_59a0._8_4_ ^ 0xffffffff;
                aVar20._12_4_ = local_59a0._12_4_ ^ 0xffffffff;
                aVar20._16_4_ = local_59a0._16_4_ ^ 0xffffffff;
                aVar20._20_4_ = local_59a0._20_4_ ^ 0xffffffff;
                aVar20._24_4_ = local_59a0._24_4_ ^ 0xffffffff;
                aVar20._28_4_ = local_59a0._28_4_ ^ 0xffffffff;
                local_59a8 = (ulong)(uVar16 & 0xf) - 7;
                goto LAB_016b32bc;
              }
              break;
            }
            uVar13 = uVar17 & 0xfffffffffffffff0;
            aVar24.i[2] = 0x7f800000;
            aVar24._0_8_ = 0x7f8000007f800000;
            aVar24.i[3] = 0x7f800000;
            aVar24.i[4] = 0x7f800000;
            aVar24.i[5] = 0x7f800000;
            aVar24.i[6] = 0x7f800000;
            aVar24.i[7] = 0x7f800000;
            uVar17 = 8;
            for (lVar14 = -0x20;
                (lVar14 != 0 && (uVar3 = *(ulong *)(uVar13 + 0x40 + lVar14 * 2), uVar3 != 8));
                lVar14 = lVar14 + 4) {
              uVar2 = *(undefined4 *)(uVar13 + 0x120 + lVar14);
              auVar30._4_4_ = uVar2;
              auVar30._0_4_ = uVar2;
              auVar30._8_4_ = uVar2;
              auVar30._12_4_ = uVar2;
              auVar30._16_4_ = uVar2;
              auVar30._20_4_ = uVar2;
              auVar30._24_4_ = uVar2;
              auVar30._28_4_ = uVar2;
              uVar2 = *(undefined4 *)(uVar13 + 0x60 + lVar14);
              auVar27._4_4_ = uVar2;
              auVar27._0_4_ = uVar2;
              auVar27._8_4_ = uVar2;
              auVar27._12_4_ = uVar2;
              auVar27._16_4_ = uVar2;
              auVar27._20_4_ = uVar2;
              auVar27._24_4_ = uVar2;
              auVar27._28_4_ = uVar2;
              auVar26 = *(undefined1 (*) [32])(ray + 0xe0);
              uVar2 = *(undefined4 *)(uVar13 + 0x160 + lVar14);
              auVar36._4_4_ = uVar2;
              auVar36._0_4_ = uVar2;
              auVar36._8_4_ = uVar2;
              auVar36._12_4_ = uVar2;
              auVar36._16_4_ = uVar2;
              auVar36._20_4_ = uVar2;
              auVar36._24_4_ = uVar2;
              auVar36._28_4_ = uVar2;
              auVar22 = vfmadd231ps_fma(auVar27,auVar26,auVar30);
              uVar2 = *(undefined4 *)(uVar13 + 0xa0 + lVar14);
              auVar33._4_4_ = uVar2;
              auVar33._0_4_ = uVar2;
              auVar33._8_4_ = uVar2;
              auVar33._12_4_ = uVar2;
              auVar33._16_4_ = uVar2;
              auVar33._20_4_ = uVar2;
              auVar33._24_4_ = uVar2;
              auVar33._28_4_ = uVar2;
              auVar5 = vfmadd231ps_fma(auVar33,auVar26,auVar36);
              uVar2 = *(undefined4 *)(uVar13 + 0x1a0 + lVar14);
              auVar31._4_4_ = uVar2;
              auVar31._0_4_ = uVar2;
              auVar31._8_4_ = uVar2;
              auVar31._12_4_ = uVar2;
              auVar31._16_4_ = uVar2;
              auVar31._20_4_ = uVar2;
              auVar31._24_4_ = uVar2;
              auVar31._28_4_ = uVar2;
              uVar2 = *(undefined4 *)(uVar13 + 0xe0 + lVar14);
              auVar37._4_4_ = uVar2;
              auVar37._0_4_ = uVar2;
              auVar37._8_4_ = uVar2;
              auVar37._12_4_ = uVar2;
              auVar37._16_4_ = uVar2;
              auVar37._20_4_ = uVar2;
              auVar37._24_4_ = uVar2;
              auVar37._28_4_ = uVar2;
              uVar2 = *(undefined4 *)(uVar13 + 0x140 + lVar14);
              auVar39._4_4_ = uVar2;
              auVar39._0_4_ = uVar2;
              auVar39._8_4_ = uVar2;
              auVar39._12_4_ = uVar2;
              auVar39._16_4_ = uVar2;
              auVar39._20_4_ = uVar2;
              auVar39._24_4_ = uVar2;
              auVar39._28_4_ = uVar2;
              uVar2 = *(undefined4 *)(uVar13 + 0x80 + lVar14);
              auVar41._4_4_ = uVar2;
              auVar41._0_4_ = uVar2;
              auVar41._8_4_ = uVar2;
              auVar41._12_4_ = uVar2;
              auVar41._16_4_ = uVar2;
              auVar41._20_4_ = uVar2;
              auVar41._24_4_ = uVar2;
              auVar41._28_4_ = uVar2;
              auVar6 = vfmadd231ps_fma(auVar37,auVar26,auVar31);
              auVar8 = vfmadd231ps_fma(auVar41,auVar26,auVar39);
              uVar2 = *(undefined4 *)(uVar13 + 0x180 + lVar14);
              auVar32._4_4_ = uVar2;
              auVar32._0_4_ = uVar2;
              auVar32._8_4_ = uVar2;
              auVar32._12_4_ = uVar2;
              auVar32._16_4_ = uVar2;
              auVar32._20_4_ = uVar2;
              auVar32._24_4_ = uVar2;
              auVar32._28_4_ = uVar2;
              uVar2 = *(undefined4 *)(uVar13 + 0xc0 + lVar14);
              auVar40._4_4_ = uVar2;
              auVar40._0_4_ = uVar2;
              auVar40._8_4_ = uVar2;
              auVar40._12_4_ = uVar2;
              auVar40._16_4_ = uVar2;
              auVar40._20_4_ = uVar2;
              auVar40._24_4_ = uVar2;
              auVar40._28_4_ = uVar2;
              uVar2 = *(undefined4 *)(uVar13 + 0x1c0 + lVar14);
              auVar43._4_4_ = uVar2;
              auVar43._0_4_ = uVar2;
              auVar43._8_4_ = uVar2;
              auVar43._12_4_ = uVar2;
              auVar43._16_4_ = uVar2;
              auVar43._20_4_ = uVar2;
              auVar43._24_4_ = uVar2;
              auVar43._28_4_ = uVar2;
              auVar9 = vfmadd231ps_fma(auVar40,auVar26,auVar32);
              uVar2 = *(undefined4 *)(uVar13 + 0x100 + lVar14);
              auVar44._4_4_ = uVar2;
              auVar44._0_4_ = uVar2;
              auVar44._8_4_ = uVar2;
              auVar44._12_4_ = uVar2;
              auVar44._16_4_ = uVar2;
              auVar44._20_4_ = uVar2;
              auVar44._24_4_ = uVar2;
              auVar44._28_4_ = uVar2;
              auVar10 = vfmadd231ps_fma(auVar44,auVar26,auVar43);
              auVar12._4_4_ = fStack_587c;
              auVar12._0_4_ = local_5880;
              auVar12._8_4_ = fStack_5878;
              auVar12._12_4_ = fStack_5874;
              auVar12._16_4_ = fStack_5870;
              auVar12._20_4_ = fStack_586c;
              auVar12._24_4_ = fStack_5868;
              auVar12._28_4_ = uStack_5864;
              auVar22 = vfmadd213ps_fma(ZEXT1632(auVar22),auVar46._0_32_,auVar12);
              auVar11._4_4_ = fStack_589c;
              auVar11._0_4_ = local_58a0;
              auVar11._8_4_ = fStack_5898;
              auVar11._12_4_ = fStack_5894;
              auVar11._16_4_ = fStack_5890;
              auVar11._20_4_ = fStack_588c;
              auVar11._24_4_ = fStack_5888;
              auVar11._28_4_ = uStack_5884;
              auVar5 = vfmadd213ps_fma(ZEXT1632(auVar5),auVar47._0_32_,auVar11);
              auVar7._4_4_ = fStack_58bc;
              auVar7._0_4_ = local_58c0;
              auVar7._8_4_ = fStack_58b8;
              auVar7._12_4_ = fStack_58b4;
              auVar7._16_4_ = fStack_58b0;
              auVar7._20_4_ = fStack_58ac;
              auVar7._24_4_ = fStack_58a8;
              auVar7._28_4_ = uStack_58a4;
              auVar6 = vfmadd213ps_fma(ZEXT1632(auVar6),auVar48._0_32_,auVar7);
              auVar8 = vfmadd213ps_fma(ZEXT1632(auVar8),auVar46._0_32_,auVar12);
              auVar9 = vfmadd213ps_fma(ZEXT1632(auVar9),auVar47._0_32_,auVar11);
              auVar10 = vfmadd213ps_fma(ZEXT1632(auVar10),auVar48._0_32_,auVar7);
              auVar21 = vpminsd_avx2(ZEXT1632(auVar22),ZEXT1632(auVar8));
              auVar23 = vpminsd_avx2(ZEXT1632(auVar5),ZEXT1632(auVar9));
              auVar21 = vpmaxsd_avx2(auVar21,auVar23);
              auVar23 = vpminsd_avx2(ZEXT1632(auVar6),ZEXT1632(auVar10));
              auVar23 = vpmaxsd_avx2(auVar21,auVar23);
              auVar21 = vpmaxsd_avx2(ZEXT1632(auVar22),ZEXT1632(auVar8));
              auVar35 = vpmaxsd_avx2(ZEXT1632(auVar5),ZEXT1632(auVar9));
              auVar35 = vpminsd_avx2(auVar21,auVar35);
              auVar21 = vpmaxsd_avx2(ZEXT1632(auVar6),ZEXT1632(auVar10));
              auVar21 = vpminsd_avx2(auVar21,local_58e0);
              auVar35 = vpminsd_avx2(auVar35,auVar21);
              auVar21 = vpmaxsd_avx2(auVar23,(undefined1  [32])local_5860);
              auVar21 = vcmpps_avx(auVar21,auVar35,2);
              if ((uVar16 & 7) == 6) {
                uVar2 = *(undefined4 *)(uVar13 + 0x1e0 + lVar14);
                auVar34._4_4_ = uVar2;
                auVar34._0_4_ = uVar2;
                auVar34._8_4_ = uVar2;
                auVar34._12_4_ = uVar2;
                auVar34._16_4_ = uVar2;
                auVar34._20_4_ = uVar2;
                auVar34._24_4_ = uVar2;
                auVar34._28_4_ = uVar2;
                auVar35 = vcmpps_avx(auVar34,auVar26,2);
                uVar2 = *(undefined4 *)(uVar13 + 0x200 + lVar14);
                auVar38._4_4_ = uVar2;
                auVar38._0_4_ = uVar2;
                auVar38._8_4_ = uVar2;
                auVar38._12_4_ = uVar2;
                auVar38._16_4_ = uVar2;
                auVar38._20_4_ = uVar2;
                auVar38._24_4_ = uVar2;
                auVar38._28_4_ = uVar2;
                auVar26 = vcmpps_avx(auVar26,auVar38,1);
                auVar26 = vandps_avx(auVar35,auVar26);
                auVar26 = vandps_avx(auVar26,auVar21);
                auVar22 = vpackssdw_avx(auVar26._0_16_,auVar26._16_16_);
              }
              else {
                auVar22 = vpackssdw_avx(auVar21._0_16_,auVar21._16_16_);
              }
              auVar26 = vcmpps_avx(local_58e0,(undefined1  [32])aVar20,6);
              auVar5 = vpackssdw_avx(auVar26._0_16_,auVar26._16_16_);
              auVar22 = vpand_avx(auVar22,auVar5);
              auVar26 = vpmovzxwd_avx2(auVar22);
              auVar26 = vpslld_avx2(auVar26,0x1f);
              uVar15 = uVar17;
              aVar4 = aVar24;
              if (((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                        (auVar26 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar26 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      SUB321(auVar26 >> 0x7f,0) != '\0') ||
                     (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    SUB321(auVar26 >> 0xbf,0) != '\0') ||
                   (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   auVar26[0x1f] < '\0') &&
                 (auVar28._8_4_ = 0x7f800000, auVar28._0_8_ = 0x7f8000007f800000,
                 auVar28._12_4_ = 0x7f800000, auVar28._16_4_ = 0x7f800000,
                 auVar28._20_4_ = 0x7f800000, auVar28._24_4_ = 0x7f800000,
                 auVar28._28_4_ = 0x7f800000,
                 aVar4 = (anon_union_32_3_898e2e57_for_vboolf_impl<8>_1)
                         vblendvps_avx(auVar28,auVar23,auVar26), uVar15 = uVar3, uVar17 != 8)) {
                *puVar19 = uVar17;
                puVar19 = puVar19 + 1;
                *paVar18 = aVar24;
                paVar18 = paVar18 + 1;
              }
              aVar24 = aVar4;
              uVar17 = uVar15;
            }
            aVar20 = aVar24;
          } while (uVar17 != 8);
        }
        goto LAB_016b3039;
      }
LAB_016b3378:
      auVar26 = vandps_avx(local_59a0,local_5960);
      auVar25._8_4_ = 0xff800000;
      auVar25._0_8_ = 0xff800000ff800000;
      auVar25._12_4_ = 0xff800000;
      auVar25._16_4_ = 0xff800000;
      auVar25._20_4_ = 0xff800000;
      auVar25._24_4_ = 0xff800000;
      auVar25._28_4_ = 0xff800000;
      auVar26 = vmaskmovps_avx(auVar26,auVar25);
      *(undefined1 (*) [32])local_59c0 = auVar26;
    }
  }
  return;
  while( true ) {
    prim = local_59b0;
    local_59b0 = local_59b0 + 1;
    local_5980 = aVar20;
    InstanceIntersectorKMB<8>::occluded
              ((vbool<8> *)&local_5840.field_1,(vbool<8> *)&local_5980.field_1,&local_59c1,ray,
               local_59b8,prim);
    aVar20.v = (__m256)vandnps_avx(local_5840.v,local_5980.v);
    auVar26 = (undefined1  [32])local_5980 & ~(undefined1  [32])local_5840;
    aVar24 = local_5840;
    if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar26 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar26 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar26 >> 0x7f,0) == '\0') &&
          (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar26 >> 0xbf,0) == '\0') &&
        (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar26[0x1f])
    break;
LAB_016b32bc:
    local_59a8 = local_59a8 + -1;
    if (local_59a8 == 0) break;
  }
  auVar26 = vpcmpeqd_avx2((undefined1  [32])aVar24,(undefined1  [32])aVar24);
  auVar21._0_4_ = aVar20.i[0] ^ auVar26._0_4_;
  auVar21._4_4_ = aVar20.i[1] ^ auVar26._4_4_;
  auVar21._8_4_ = aVar20.i[2] ^ auVar26._8_4_;
  auVar21._12_4_ = aVar20.i[3] ^ auVar26._12_4_;
  auVar21._16_4_ = aVar20.i[4] ^ auVar26._16_4_;
  auVar21._20_4_ = aVar20.i[5] ^ auVar26._20_4_;
  auVar21._24_4_ = aVar20.i[6] ^ auVar26._24_4_;
  auVar21._28_4_ = aVar20.i[7] ^ auVar26._28_4_;
  local_59a0 = vorps_avx(local_59a0,auVar21);
  auVar26 = auVar26 & ~local_59a0;
  if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
           (auVar26 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
          (auVar26 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
         SUB321(auVar26 >> 0x7f,0) == '\0') &&
        (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
       SUB321(auVar26 >> 0xbf,0) == '\0') &&
      (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar26[0x1f])
  goto LAB_016b3378;
  auVar26._8_4_ = 0xff800000;
  auVar26._0_8_ = 0xff800000ff800000;
  auVar26._12_4_ = 0xff800000;
  auVar26._16_4_ = 0xff800000;
  auVar26._20_4_ = 0xff800000;
  auVar26._24_4_ = 0xff800000;
  auVar26._28_4_ = 0xff800000;
  auVar26 = vblendvps_avx(local_58e0,auVar26,local_59a0);
  auVar45 = ZEXT3264(auVar26);
  auVar46 = ZEXT3264(local_5900);
  auVar47 = ZEXT3264(local_5920);
  auVar48 = ZEXT3264(local_5940);
  goto LAB_016b3039;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }